

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O0

void __thiscall QNetworkReplyImplPrivate::_q_bufferOutgoingData(QNetworkReplyImplPrivate *this)

{
  bool bVar1;
  QNetworkReplyImpl *pQVar2;
  element_type *peVar3;
  QNetworkReplyImplPrivate *this_00;
  long lVar4;
  QNetworkReplyImplPrivate *in_RDI;
  long in_FS_OFFSET;
  char *dst;
  qint64 bytesToBuffer;
  qint64 bytesBuffered;
  QNetworkReplyImpl *q;
  shared_ptr<QRingBuffer> *in_stack_ffffffffffffffb0;
  Connection local_28;
  Connection local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = q_func(in_RDI);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->outgoingDataBuffer);
  if (!bVar1) {
    std::make_shared<QRingBuffer>();
    std::shared_ptr<QRingBuffer>::operator=
              (in_stack_ffffffffffffffb0,(shared_ptr<QRingBuffer> *)in_RDI);
    std::shared_ptr<QRingBuffer>::~shared_ptr((shared_ptr<QRingBuffer> *)0x1ea90f);
    QObject::connect((QObject *)local_20,(char *)in_RDI->outgoingData,(QObject *)"2readyRead()",
                     (char *)pQVar2,0x3c4578);
    QMetaObject::Connection::~Connection(local_20);
    QObject::connect((QObject *)&local_28,(char *)in_RDI->outgoingData,
                     (QObject *)"2readChannelFinished()",(char *)pQVar2,0x3c45a8);
    QMetaObject::Connection::~Connection(&local_28);
  }
  do {
    (**(code **)(*(long *)in_RDI->outgoingData + 0xa0))();
    peVar3 = std::__shared_ptr_access<QRingBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QRingBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1ea9c5);
    this_00 = (QNetworkReplyImplPrivate *)QRingBuffer::reserve((longlong)peVar3);
    lVar4 = QIODevice::read((char *)in_RDI->outgoingData,(longlong)this_00);
    if (lVar4 == -1) {
      peVar3 = std::__shared_ptr_access<QRingBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QRingBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1eaa11);
      QRingBuffer::chop((longlong)peVar3);
      _q_bufferOutgoingDataFinished(this_00);
LAB_001eaa79:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return;
      }
      __stack_chk_fail();
    }
    if (lVar4 == 0) {
      peVar3 = std::__shared_ptr_access<QRingBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QRingBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1eaa41);
      QRingBuffer::chop((longlong)peVar3);
      goto LAB_001eaa79;
    }
    peVar3 = std::__shared_ptr_access<QRingBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QRingBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1eaa60);
    QRingBuffer::chop((longlong)peVar3);
  } while( true );
}

Assistant:

void QNetworkReplyImplPrivate::_q_bufferOutgoingData()
{
    Q_Q(QNetworkReplyImpl);

    if (!outgoingDataBuffer) {
        // first call, create our buffer
        outgoingDataBuffer = std::make_shared<QRingBuffer>();

        QObject::connect(outgoingData, SIGNAL(readyRead()), q, SLOT(_q_bufferOutgoingData()));
        QObject::connect(outgoingData, SIGNAL(readChannelFinished()), q, SLOT(_q_bufferOutgoingDataFinished()));
    }

    qint64 bytesBuffered = 0;
    qint64 bytesToBuffer = 0;

    // read data into our buffer
    forever {
        bytesToBuffer = outgoingData->bytesAvailable();
        // unknown? just try 2 kB, this also ensures we always try to read the EOF
        if (bytesToBuffer <= 0)
            bytesToBuffer = 2*1024;

        char *dst = outgoingDataBuffer->reserve(bytesToBuffer);
        bytesBuffered = outgoingData->read(dst, bytesToBuffer);

        if (bytesBuffered == -1) {
            // EOF has been reached.
            outgoingDataBuffer->chop(bytesToBuffer);

            _q_bufferOutgoingDataFinished();
            break;
        } else if (bytesBuffered == 0) {
            // nothing read right now, just wait until we get called again
            outgoingDataBuffer->chop(bytesToBuffer);

            break;
        } else {
            // don't break, try to read() again
            outgoingDataBuffer->chop(bytesToBuffer - bytesBuffered);
        }
    }